

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

HighsStatus __thiscall HEkk::setBasis(HEkk *this)

{
  double dVar1;
  double val;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  SimplexBasis *in_RDI;
  HighsInt iVar;
  HighsInt iRow;
  int8_t move;
  double upper;
  double lower;
  HighsInt iCol;
  HighsInt num_row;
  HighsInt num_col;
  HighsInt in_stack_ffffffffffffffb8;
  HighsInt in_stack_ffffffffffffffbc;
  int local_30;
  value_type local_29;
  int index;
  HighsInt HVar7;
  HighsInt HVar8;
  
  HVar8 = in_RDI[0x47].debug_id;
  HVar7 = in_RDI[0x47].debug_update_count;
  SimplexBasis::setup(in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  std::__cxx11::string::operator=((string *)&in_RDI[0x59].nonbasicFlag_,"HEkk::setBasis - logical");
  for (index = 0; index < HVar8; index = index + 1) {
    pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       ((vector<signed_char,_std::allocator<signed_char>_> *)&in_RDI[0x58].debug_id,
                        (long)index);
    *pvVar4 = '\x01';
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        ((long)&in_RDI[0x47].debug_origin_name.field_2 + 8),(long)index);
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[0x48].basicIndex_.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(long)index);
    val = *pvVar5;
    if ((dVar1 != val) || (NAN(dVar1) || NAN(val))) {
      bVar2 = highs_isInfinity(-dVar1);
      if (bVar2) {
        bVar2 = highs_isInfinity(val);
        if (bVar2) {
          local_29 = '\0';
        }
        else {
          local_29 = -1;
        }
      }
      else {
        bVar2 = highs_isInfinity(val);
        if (bVar2) {
          local_29 = '\x01';
        }
        else if (ABS(val) <= ABS(dVar1)) {
          local_29 = -1;
        }
        else {
          local_29 = '\x01';
        }
      }
    }
    else {
      local_29 = '\0';
    }
    pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       ((vector<signed_char,_std::allocator<signed_char>_> *)
                        &in_RDI[0x58].debug_origin_name.field_2,(long)index);
    *pvVar4 = local_29;
  }
  for (local_30 = 0; local_30 < HVar7; local_30 = local_30 + 1) {
    iVar3 = HVar8 + local_30;
    pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       ((vector<signed_char,_std::allocator<signed_char>_> *)&in_RDI[0x58].debug_id,
                        (long)iVar3);
    *pvVar4 = '\0';
    HighsHashHelpers::sparse_combine((u64 *)CONCAT44(HVar8,HVar7),index);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &in_RDI[0x58].nonbasicMove_.
                         super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long)local_30);
    *pvVar6 = iVar3;
  }
  *(HighsInt *)
   &in_RDI[0x58].nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = HVar7;
  *(undefined1 *)((long)&in_RDI[0x4f].hash + 4) = 1;
  return kOk;
}

Assistant:

HighsStatus HEkk::setBasis() {
  // Set up nonbasicFlag and basicIndex for a logical basis
  const HighsInt num_col = lp_.num_col_;
  const HighsInt num_row = lp_.num_row_;

  basis_.setup(num_col, num_row);
  basis_.debug_origin_name = "HEkk::setBasis - logical";

  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    basis_.nonbasicFlag_[iCol] = kNonbasicFlagTrue;
    double lower = lp_.col_lower_[iCol];
    double upper = lp_.col_upper_[iCol];
    int8_t move = kIllegalMoveValue;
    if (lower == upper) {
      // Fixed
      move = kNonbasicMoveZe;
    } else if (!highs_isInfinity(-lower)) {
      // Finite lower bound so boxed or lower
      if (!highs_isInfinity(upper)) {
        // Finite upper bound so boxed. Set to bound of LP that is closer to
        // zero
        if (move == kIllegalMoveValue) {
          if (fabs(lower) < fabs(upper)) {
            move = kNonbasicMoveUp;
          } else {
            move = kNonbasicMoveDn;
          }
        }
      } else {
        // Lower (since upper bound is infinite)
        move = kNonbasicMoveUp;
      }
    } else if (!highs_isInfinity(upper)) {
      // Upper
      move = kNonbasicMoveDn;
    } else {
      // FREE
      move = kNonbasicMoveZe;
    }
    assert(move != kIllegalMoveValue);
    basis_.nonbasicMove_[iCol] = move;
  }
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    HighsInt iVar = num_col + iRow;
    basis_.nonbasicFlag_[iVar] = kNonbasicFlagFalse;
    HighsHashHelpers::sparse_combine(basis_.hash, iVar);
    basis_.basicIndex_[iRow] = iVar;
  }
  info_.num_basic_logicals = num_row;
  status_.has_basis = true;
  return HighsStatus::kOk;
}